

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeBinary(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  char cVar1;
  uint32_t uVar2;
  Id IVar3;
  Type TVar4;
  Expression *pEVar5;
  Expression *pEVar6;
  Expression *pEVar7;
  BinaryArgs local_58;
  Id local_3c;
  Type local_38;
  Type type_local;
  
  local_38.id = type.id;
  cVar1 = ::wasm::Type::isTuple();
  if (cVar1 != '\0') {
    __assert_fail("!type.isTuple()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                  ,0x9ed,"Expression *wasm::TranslateToFuzzReader::makeBinary(Type)");
  }
  if (local_38.id == 1) {
    TVar4 = getSingleConcreteType(this);
    pEVar5 = makeBinary(this,TVar4);
    if (pEVar5->_id == BinaryId) {
      local_3c = pEVar5[1]._id;
      pEVar5 = make(this,(Type)0x1);
      pEVar6 = make(this,(Type)0x1);
      pEVar7 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
      pEVar7->_id = BinaryId;
      (pEVar7->type).id = 0;
      pEVar7[1]._id = local_3c;
      pEVar7[1].type.id = (uintptr_t)pEVar5;
      *(Expression **)(pEVar7 + 2) = pEVar6;
      ::wasm::Binary::finalize();
      return pEVar7;
    }
  }
  else {
    cVar1 = ::wasm::Type::isRef();
    if (cVar1 == '\0') {
      if (6 < local_38.id) {
        __assert_fail("isBasic() && \"Basic type expected\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                      ,0xc6,"BasicType wasm::Type::getBasic() const");
      }
      switch(local_38.id & 0xffffffff) {
      case 0:
      case 1:
        ::wasm::handle_unreachable
                  ("unexpected type",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xacd);
      case 2:
        this_00 = &this->random;
        uVar2 = Random::upTo(this_00,4);
        switch(uVar2) {
        case 0:
          local_58.a = Random::
                       pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                                 (this_00,AddInt32,SubInt32,MulInt32,DivSInt32,DivUInt32,RemSInt32,
                                  RemUInt32,AndInt32,OrInt32,XorInt32,ShlInt32,ShrUInt32,ShrSInt32,
                                  RotLInt32,RotRInt32,EqInt32,NeInt32,LtSInt32,LtUInt32,LeSInt32,
                                  LeUInt32,GtSInt32,GtUInt32,GeSInt32,GeUInt32);
          local_58.b = make(this,(Type)0x2);
          TVar4.id = 2;
          break;
        case 1:
          local_58.a = Random::
                       pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                                 (this_00,EqInt64,NeInt64,LtSInt64,LtUInt64,LeSInt64,LeUInt64,
                                  GtSInt64,GtUInt64,GeSInt64,GeUInt64);
          local_58.b = make(this,(Type)0x3);
          TVar4.id = 3;
          break;
        case 2:
          local_58.a = Random::
                       pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                                 (this_00,EqFloat32,NeFloat32,LtFloat32,LeFloat32,GtFloat32,
                                  GeFloat32);
          local_58.b = make(this,(Type)0x4);
          TVar4.id = 4;
          break;
        case 3:
          local_58.a = Random::
                       pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                                 (this_00,EqFloat64,NeFloat64,LtFloat64,LeFloat64,GtFloat64,
                                  GeFloat64);
          local_58.b = make(this,(Type)0x5);
          TVar4.id = 5;
          break;
        default:
          ::wasm::handle_unreachable
                    ("invalid value",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                     ,0xa3a);
        }
        local_58.c = make(this,TVar4);
        pEVar5 = buildBinary(this,&local_58);
        return pEVar5;
      case 3:
        IVar3 = Random::
                pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                          (&this->random,AddInt64,SubInt64,MulInt64,DivSInt64,DivUInt64,RemSInt64,
                           RemUInt64,AndInt64,OrInt64,XorInt64,ShlInt64,ShrUInt64,ShrSInt64,
                           RotLInt64,RotRInt64);
        pEVar5 = make(this,(Type)0x3);
        TVar4.id = 3;
        break;
      case 4:
        IVar3 = Random::
                pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                          (&this->random,AddFloat32,SubFloat32,MulFloat32,DivFloat32,CopySignFloat32
                           ,MinFloat32,MaxFloat32);
        pEVar5 = make(this,(Type)0x4);
        TVar4.id = 4;
        break;
      case 5:
        IVar3 = Random::
                pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                          (&this->random,AddFloat64,SubFloat64,MulFloat64,DivFloat64,CopySignFloat64
                           ,MinFloat64,MaxFloat64);
        pEVar5 = make(this,(Type)0x5);
        TVar4.id = 5;
        break;
      case 6:
        if (((this->wasm->features).features & 8) == 0) {
          __assert_fail("wasm.features.hasSIMD()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                        ,0xa66,"Expression *wasm::TranslateToFuzzReader::makeBinary(Type)");
        }
        IVar3 = Random::
                pick<wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp,wasm::BinaryOp>
                          (&this->random,0x4c,0x4d,0x4e,0x4f,0x50,0x51,0x52,0x53,0x54,0x55,0x56,0x57
                           ,0x58,0x59,0x5a,0x5b,0x5c,0x5d,0x5e,0x5f,0x60,0x61,0x62,99,100,0x65,0x66,
                           0x67,0x68,0x69,0x70,0x71,0x72,0x73,0x74,0x75,0x76,0x77,0x78,0x79,0x7a,
                           0x7b,0x7c,0x7d,0x7e,0x7f,0x80,0x81,0x82,0x83,0x84,0x85,0x86,0x87,0x88,
                           0x89,0x8b,0x8c,0x8d,0x8e,0x8f,0x90,0x91,0x92,0x93,0x94,0x95);
        pEVar5 = make(this,(Type)0x6);
        TVar4.id = 6;
        break;
      default:
        ::wasm::handle_unreachable
                  ("invalid type",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                   ,0xacf);
      }
      pEVar6 = make(this,TVar4);
      pEVar7 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x28,8);
      pEVar7->_id = BinaryId;
      (pEVar7->type).id = 0;
      pEVar7[1]._id = IVar3;
      pEVar7[1].type.id = (uintptr_t)pEVar5;
      *(Expression **)(pEVar7 + 2) = pEVar6;
      ::wasm::Binary::finalize();
      return pEVar7;
    }
  }
  pEVar5 = makeTrivial(this,local_38);
  return pEVar5;
}

Assistant:

Expression* TranslateToFuzzReader::makeBinary(Type type) {
  assert(!type.isTuple());
  if (type == Type::unreachable) {
    if (auto* binary = makeBinary(getSingleConcreteType())->dynCast<Binary>()) {
      return buildBinary(
        {binary->op, make(Type::unreachable), make(Type::unreachable)});
    }
    // give up
    return makeTrivial(type);
  }
  // There are no binary ops for reference types.
  // TODO: Use struct.new
  if (type.isRef()) {
    return makeTrivial(type);
  }
  switch (type.getBasic()) {
    case Type::i32: {
      switch (upTo(4)) {
        case 0:
          return buildBinary({pick(AddInt32,
                                   SubInt32,
                                   MulInt32,
                                   DivSInt32,
                                   DivUInt32,
                                   RemSInt32,
                                   RemUInt32,
                                   AndInt32,
                                   OrInt32,
                                   XorInt32,
                                   ShlInt32,
                                   ShrUInt32,
                                   ShrSInt32,
                                   RotLInt32,
                                   RotRInt32,
                                   EqInt32,
                                   NeInt32,
                                   LtSInt32,
                                   LtUInt32,
                                   LeSInt32,
                                   LeUInt32,
                                   GtSInt32,
                                   GtUInt32,
                                   GeSInt32,
                                   GeUInt32),
                              make(Type::i32),
                              make(Type::i32)});
        case 1:
          return buildBinary({pick(EqInt64,
                                   NeInt64,
                                   LtSInt64,
                                   LtUInt64,
                                   LeSInt64,
                                   LeUInt64,
                                   GtSInt64,
                                   GtUInt64,
                                   GeSInt64,
                                   GeUInt64),
                              make(Type::i64),
                              make(Type::i64)});
        case 2:
          return buildBinary({pick(EqFloat32,
                                   NeFloat32,
                                   LtFloat32,
                                   LeFloat32,
                                   GtFloat32,
                                   GeFloat32),
                              make(Type::f32),
                              make(Type::f32)});
        case 3:
          return buildBinary({pick(EqFloat64,
                                   NeFloat64,
                                   LtFloat64,
                                   LeFloat64,
                                   GtFloat64,
                                   GeFloat64),
                              make(Type::f64),
                              make(Type::f64)});
      }
      WASM_UNREACHABLE("invalid value");
    }
    case Type::i64: {
      return buildBinary({pick(AddInt64,
                               SubInt64,
                               MulInt64,
                               DivSInt64,
                               DivUInt64,
                               RemSInt64,
                               RemUInt64,
                               AndInt64,
                               OrInt64,
                               XorInt64,
                               ShlInt64,
                               ShrUInt64,
                               ShrSInt64,
                               RotLInt64,
                               RotRInt64),
                          make(Type::i64),
                          make(Type::i64)});
    }
    case Type::f32: {
      return buildBinary({pick(AddFloat32,
                               SubFloat32,
                               MulFloat32,
                               DivFloat32,
                               CopySignFloat32,
                               MinFloat32,
                               MaxFloat32),
                          make(Type::f32),
                          make(Type::f32)});
    }
    case Type::f64: {
      return buildBinary({pick(AddFloat64,
                               SubFloat64,
                               MulFloat64,
                               DivFloat64,
                               CopySignFloat64,
                               MinFloat64,
                               MaxFloat64),
                          make(Type::f64),
                          make(Type::f64)});
    }
    case Type::v128: {
      assert(wasm.features.hasSIMD());
      return buildBinary({pick(EqVecI8x16,
                               NeVecI8x16,
                               LtSVecI8x16,
                               LtUVecI8x16,
                               GtSVecI8x16,
                               GtUVecI8x16,
                               LeSVecI8x16,
                               LeUVecI8x16,
                               GeSVecI8x16,
                               GeUVecI8x16,
                               EqVecI16x8,
                               NeVecI16x8,
                               LtSVecI16x8,
                               LtUVecI16x8,
                               GtSVecI16x8,
                               GtUVecI16x8,
                               LeSVecI16x8,
                               LeUVecI16x8,
                               GeSVecI16x8,
                               GeUVecI16x8,
                               EqVecI32x4,
                               NeVecI32x4,
                               LtSVecI32x4,
                               LtUVecI32x4,
                               GtSVecI32x4,
                               GtUVecI32x4,
                               LeSVecI32x4,
                               LeUVecI32x4,
                               GeSVecI32x4,
                               GeUVecI32x4,
                               EqVecF32x4,
                               NeVecF32x4,
                               LtVecF32x4,
                               GtVecF32x4,
                               LeVecF32x4,
                               GeVecF32x4,
                               EqVecF64x2,
                               NeVecF64x2,
                               LtVecF64x2,
                               GtVecF64x2,
                               LeVecF64x2,
                               GeVecF64x2,
                               AndVec128,
                               OrVec128,
                               XorVec128,
                               AndNotVec128,
                               AddVecI8x16,
                               AddSatSVecI8x16,
                               AddSatUVecI8x16,
                               SubVecI8x16,
                               SubSatSVecI8x16,
                               SubSatUVecI8x16,
                               MinSVecI8x16,
                               MinUVecI8x16,
                               MaxSVecI8x16,
                               MaxUVecI8x16,
                               // TODO: avgr_u
                               // TODO: q15mulr_sat_s
                               // TODO: extmul
                               AddVecI16x8,
                               AddSatSVecI16x8,
                               AddSatUVecI16x8,
                               SubVecI16x8,
                               SubSatSVecI16x8,
                               SubSatUVecI16x8,
                               MulVecI16x8,
                               MinSVecI16x8,
                               MinUVecI16x8,
                               MaxSVecI16x8,
                               MaxUVecI16x8,
                               AddVecI32x4,
                               SubVecI32x4,
                               MulVecI32x4,
                               MinSVecI32x4,
                               MinUVecI32x4,
                               MaxSVecI32x4,
                               MaxUVecI32x4,
                               DotSVecI16x8ToVecI32x4,
                               AddVecI64x2,
                               SubVecI64x2,
                               AddVecF32x4,
                               SubVecF32x4,
                               MulVecF32x4,
                               DivVecF32x4,
                               MinVecF32x4,
                               MaxVecF32x4,
                               AddVecF64x2,
                               SubVecF64x2,
                               MulVecF64x2,
                               DivVecF64x2,
                               MinVecF64x2,
                               MaxVecF64x2,
                               NarrowSVecI16x8ToVecI8x16,
                               NarrowUVecI16x8ToVecI8x16,
                               NarrowSVecI32x4ToVecI16x8,
                               NarrowUVecI32x4ToVecI16x8,
                               SwizzleVecI8x16),
                          make(Type::v128),
                          make(Type::v128)});
    }
    case Type::none:
    case Type::unreachable:
      WASM_UNREACHABLE("unexpected type");
  }
  WASM_UNREACHABLE("invalid type");
}